

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void * __thiscall llvm::MallocAllocator::Allocate(MallocAllocator *this,size_t Size,size_t param_2)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  void *pvVar4;
  undefined8 *puVar5;
  SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this_00;
  
  puVar5 = (undefined8 *)Size;
  this_00 = (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *)Size;
  pvVar4 = malloc(Size);
  if (pvVar4 != (void *)0x0) {
    return pvVar4;
  }
  if (Size == 0) {
    this_00 = (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *)0x1;
    pvVar4 = malloc(1);
    if (pvVar4 != (void *)0x0) {
      return pvVar4;
    }
  }
  else {
    Allocate();
  }
  Allocate();
  uVar3 = (this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  if ((this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::grow(this_00,0);
    uVar3 = (this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = puVar5[1];
  puVar1 = (undefined8 *)
           ((long)(this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>)
                  .super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = *puVar5;
  puVar1[1] = uVar2;
  uVar3 = (this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  if ((this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    __assert_fail("N <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  uVar3 = uVar3 + 1;
  (this_00->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
  super_SmallVectorBase.Size = uVar3;
  return (void *)(ulong)uVar3;
}

Assistant:

LLVM_ATTRIBUTE_RETURNS_NONNULL void *Allocate(size_t Size,
                                                size_t /*Alignment*/) {
    return safe_malloc(Size);
  }